

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O0

SDL12_TimerID SDL_AddTimer(Uint32 interval,SDL12_NewTimerCallback callback,void *param)

{
  Uint32 UVar1;
  SDL_TimerID SVar2;
  SDL12_TimerID data;
  void *param_local;
  SDL12_NewTimerCallback callback_local;
  SDL12_TimerID_Data *pSStack_10;
  Uint32 interval_local;
  
  pSStack_10 = (SDL12_TimerID_Data *)(*SDL20_malloc)(0x28);
  if (pSStack_10 == (SDL12_TimerID_Data *)0x0) {
    (*SDL20_Error)(SDL_ENOMEM);
    pSStack_10 = (SDL12_TimerID_Data *)0x0;
  }
  else {
    UVar1 = RoundTimerTo12Resolution(interval);
    pSStack_10->callback = callback;
    pSStack_10->param = param;
    SVar2 = (*SDL20_AddTimer)(UVar1,AddTimerCallback12,pSStack_10);
    pSStack_10->timer_id = SVar2;
    if (pSStack_10->timer_id == 0) {
      (*SDL20_free)(pSStack_10);
      pSStack_10 = (SDL12_TimerID_Data *)0x0;
    }
    else {
      if (EventQueueMutex != (SDL_mutex *)0x0) {
        (*SDL20_LockMutex)(EventQueueMutex);
      }
      pSStack_10->prev = (SDL12_TimerID_Data *)0x0;
      pSStack_10->next = AddedTimers;
      if (AddedTimers != (SDL12_TimerID)0x0) {
        AddedTimers->prev = pSStack_10;
      }
      AddedTimers = pSStack_10;
      if (EventQueueMutex != (SDL_mutex *)0x0) {
        (*SDL20_UnlockMutex)(EventQueueMutex);
      }
    }
  }
  return pSStack_10;
}

Assistant:

SDLCALL
SDL_AddTimer(Uint32 interval, SDL12_NewTimerCallback callback, void *param)
{
    SDL12_TimerID data = (SDL12_TimerID) SDL20_malloc(sizeof (SDL12_TimerID_Data));
    if (!data) {
        SDL20_OutOfMemory();
        return NULL;
    }

    interval = RoundTimerTo12Resolution(interval);
    data->callback = callback;
    data->param = param;
    data->timer_id = SDL20_AddTimer(interval, AddTimerCallback12, data);

    if (!data->timer_id) {
        SDL20_free(data);
        return NULL;
    }

    if (EventQueueMutex) {
        SDL20_LockMutex(EventQueueMutex);
    }

    data->prev = NULL;
    data->next = AddedTimers;
    if (AddedTimers) {
        AddedTimers->prev = data;
    }
    AddedTimers = data;

    if (EventQueueMutex) {
        SDL20_UnlockMutex(EventQueueMutex);
    }

    return data;
}